

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool GlobOpt::IsSwitchOptEnabled(Func *func)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  bool local_11;
  Func *func_local;
  
  bVar2 = Func::IsTopFunc(func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3da2,"(func->IsTopFunc())","func->IsTopFunc()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  sourceContextId = Func::GetSourceContextId(func);
  functionId = Func::GetLocalFunctionId(func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,SwitchOptPhase,sourceContextId,functionId);
  local_11 = false;
  if (!bVar2) {
    bVar2 = Func::IsSwitchOptDisabled(func);
    local_11 = false;
    if (!bVar2) {
      local_11 = Func::DoGlobOpt(func);
    }
  }
  return local_11;
}

Assistant:

bool
GlobOpt::IsSwitchOptEnabled(Func const * func)
{
    Assert(func->IsTopFunc());
    return !PHASE_OFF(Js::SwitchOptPhase, func) && !func->IsSwitchOptDisabled() && func->DoGlobOpt();
}